

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block1394.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  undefined8 uVar9;
  long lVar10;
  uint uVar11;
  char *pcVar12;
  uint uVar13;
  ulong uVar14;
  quadlet_t data1;
  ulong local_58;
  uint *local_50;
  uint local_44;
  uint local_40;
  uint local_3c;
  ulonglong local_38;
  
  signal(2,signal_handler);
  pcVar7 = strstr(*argv,"quad1394");
  if (argc < 2) {
LAB_00101860:
    pcVar12 = 
    "Usage: %s [-pP] [-nN] <address in hex> <size in quadlets> [write data quadlets in hex]\n";
    if (pcVar7 != (char *)0x0) {
      pcVar12 = "Usage: %s [-pP] [-nN] <address in hex> [value to write in hex]\n";
    }
    printf(pcVar12,*argv);
    puts("       where P = port number, N = node number");
    exit(0);
  }
  local_58 = 1;
  local_50 = &local_3c;
  uVar14 = 1;
  iVar4 = 0;
  bVar2 = false;
  uVar11 = 0;
  local_40 = 0;
  local_44 = 0;
  do {
    pcVar12 = argv[uVar14];
    if (*pcVar12 == '-') {
      cVar1 = pcVar12[1];
      if (cVar1 == 'd') {
        bVar2 = true;
      }
      else {
        if (cVar1 == 'n') {
          local_40 = atoi(pcVar12 + 2);
          pcVar12 = "Selecting node %d\n";
        }
        else {
          if (cVar1 != 'p') goto LAB_001015e9;
          local_44 = atoi(pcVar12 + 2);
          pcVar12 = "Selecting port %d\n";
        }
        printf(pcVar12);
      }
    }
    else {
      if (uVar11 == 0) {
        local_38 = strtoull(pcVar12,(char **)0x0,0x10);
      }
      else if (uVar11 == 1 && pcVar7 != (char *)0x0) {
        uVar8 = strtoul(pcVar12,(char **)0x0,0x10);
        uVar3 = (uint)uVar8;
        local_3c = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      }
      else if (uVar11 == 1 && pcVar7 == (char *)0x0) {
        local_58 = strtoul(pcVar12,(char **)0x0,10);
        local_50 = (uint *)calloc(4,(long)(int)local_58);
        if (local_50 == (uint *)0x0) {
          main_cold_1();
          goto LAB_00101860;
        }
      }
      else if ((pcVar7 == (char *)0x0) && (iVar4 < (int)local_58)) {
        uVar8 = strtoul(pcVar12,(char **)0x0,0x10);
        uVar3 = (uint)uVar8;
        lVar10 = (long)iVar4;
        iVar4 = iVar4 + 1;
        local_50[lVar10] =
             uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      }
      else {
        fprintf(_stderr,"Warning: extra parameter: %s\n");
      }
      uVar11 = uVar11 + 1;
    }
LAB_001015e9:
    uVar14 = uVar14 + 1;
  } while ((uint)argc != uVar14);
  if ((int)uVar11 < 1) goto LAB_00101860;
  handle = (raw1394handle_t)raw1394_new_handle();
  if (handle == (raw1394handle_t)0x0) {
    main_cold_7();
LAB_00101898:
    main_cold_6();
LAB_0010189d:
    main_cold_2();
  }
  else {
    raw1394_set_bus_reset_handler(handle,reset_handler);
    uVar3 = raw1394_get_port_info(handle,0,0);
    if ((int)uVar3 < 0) goto LAB_00101898;
    if (uVar3 <= local_44) goto LAB_0010189d;
    iVar4 = raw1394_set_port(handle,local_44);
    if (iVar4 == 0) {
      uVar3 = raw1394_get_local_id(handle);
      if (bVar2) {
        uVar9 = raw1394_get_libversion();
        printf("libraw1394_version = %s  local_node_id = %x\n",uVar9,(ulong)uVar3 & 0xffff);
      }
      uVar5 = raw1394_get_nodecount(handle);
      iVar4 = (int)local_58;
      if ((short)local_40 == 0x3f) {
        puts("**** Warning: Broadcasting message ");
        printf("     Address should be larger than CSR_CONFIG_ROM_END(0x%llx)\n",0xfffff0000800);
        uVar13 = uVar3 | 0x3f;
        bVar2 = 2 < uVar11;
        if (pcVar7 != (char *)0x0) {
          bVar2 = uVar11 != 1;
        }
        if (!bVar2) {
          fprintf(_stderr,"**** Error: broadcast read NOT supported on node %d (num nodes = %d)\n",
                  (ulong)(local_40 & 0xffff),(ulong)uVar5);
          goto LAB_001017cc;
        }
        iVar4 = raw1394_start_write(handle,uVar3 & 0xffff | 0x3f,local_38,(long)(iVar4 << 2),
                                    local_50,0xb);
LAB_00101791:
        if (iVar4 == 0) goto LAB_00101799;
      }
      else {
        if ((int)uVar5 <= (int)(local_40 & 0xffff)) goto LAB_001018af;
        uVar13 = local_40 + (uVar3 & 0xffffffc0);
        bVar2 = 2 < uVar11;
        if (pcVar7 != (char *)0x0) {
          bVar2 = uVar11 != 1;
        }
        if (bVar2) {
          iVar4 = raw1394_write(handle,uVar13 & 0xffff,local_38,(long)(iVar4 << 2),local_50);
          goto LAB_00101791;
        }
LAB_001017cc:
        iVar6 = raw1394_read(handle,uVar13 & 0xffff,local_38,(long)(iVar4 * 4),local_50);
        if (iVar6 == 0) {
          if (0 < iVar4) {
            uVar14 = 0;
            do {
              uVar11 = local_50[uVar14];
              printf("0x%08X\n",
                     (ulong)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                            uVar11 << 0x18));
              uVar14 = uVar14 + 1;
            } while ((local_58 & 0xffffffff) != uVar14);
          }
          goto LAB_00101799;
        }
      }
      main_cold_5();
LAB_00101799:
      if (local_50 != &local_3c) {
        free(local_50);
      }
      raw1394_destroy_handle(handle);
      return 0;
    }
  }
  main_cold_3();
LAB_001018af:
  main_cold_4();
  halt_baddata();
}

Assistant:

int main(int argc, char** argv)
{
    int i, j, rc, args_found;
    int nports;
    int port;
    nodeid_t node;
    nodeaddr_t addr;
    int size;
    quadlet_t data1;
    quadlet_t *data = &data1;

    signal(SIGINT, signal_handler);

    int isQuad1394 = (strstr(argv[0], "quad1394") != 0);
    int isBroadcast = 0;
    int isDebug = 0;

    port = 0;
    node = 0;
    size = 1;
    j = 0;
    args_found = 0;
    for (i = 1; i < argc; i++) {
        if (argv[i][0] == '-') {
            if (argv[i][1] == 'p') {
                port = atoi(argv[i]+2);
                printf("Selecting port %d\n", port);
            }
            else if (argv[i][1] == 'n') {
                node = atoi(argv[i]+2);
                printf("Selecting node %d\n", node);
            }
            else if (argv[i][1] == 'd') {
                isDebug = 1;
            }
        }
        else {
            if (args_found == 0)
                addr = strtoull(argv[i], 0, 16);
            else if ((args_found == 1) && (isQuad1394))
                data1 = bswap_32(strtoul(argv[i], 0, 16));
            else if ((args_found == 1) && (!isQuad1394)) {
                size = strtoul(argv[i], 0, 10);
                /* Allocate data array, initializing contents to 0 */
                data = (quadlet_t *) calloc(sizeof(quadlet_t), size);
                if (!data) {
                    fprintf(stderr, "Failed to allocate memory for %d quadlets", size);
                    exit(-1);
                }
            }
            else if (!isQuad1394 && (j < size))
                data[j++] = bswap_32(strtoul(argv[i], 0, 16));
            else
                fprintf(stderr, "Warning: extra parameter: %s\n", argv[i]);

            args_found++;
        }
    }

    if (args_found < 1) {
        if (isQuad1394)
            printf("Usage: %s [-pP] [-nN] <address in hex> [value to write in hex]\n", argv[0]);
        else
            printf("Usage: %s [-pP] [-nN] <address in hex> <size in quadlets> [write data quadlets in hex]\n", argv[0]);
        printf("       where P = port number, N = node number\n");
        exit(0);
    }

    /* get handle to device and check for errors */
    handle = raw1394_new_handle();
    if (handle == NULL) {
        fprintf(stderr, "**** Error: could not open 1394 handle\n");
        exit(-1);
    }

    /* set the bus reset handler */
    raw1394_set_bus_reset_handler(handle, reset_handler);

    /* get number of ports and check for errors */
    nports = raw1394_get_port_info(handle, NULL, 0);
    if (nports < 0) {
        fprintf(stderr, "**** Error: could not get port info\n");
        exit(-1);
    }
    if ((port < 0) || (port >= nports)) {
        fprintf(stderr, "**** Error: port %d does not exist (num ports = %d)\n", port, nports);
        exit(-1);
    }

    /* set handle to current port and skip errors */
    rc = raw1394_set_port(handle, port);
    if (rc) {
        fprintf(stderr, "**** Error setting port %d\n", port);
        exit(-1);
    }

    // get local id and printf libraw1394 version & local_node_id for debugging
    nodeid_t id = raw1394_get_local_id(handle);
    if (isDebug) {
        printf("libraw1394_version = %s  local_node_id = %x\n", raw1394_get_libversion(), id);
    }

    /* get number of nodes connected to current port/handle */
    int nnodes = raw1394_get_nodecount(handle);
    //    bool
    if (node == 63) {
        isBroadcast = 1;
        printf("**** Warning: Broadcasting message \n");
        printf("     Address should be larger than CSR_CONFIG_ROM_END(0x%llx)\n", CSR_CONFIG_ROM_END + CSR_REGISTER_BASE);
    } else if ((node < 0) || (node >= nnodes)) {
        fprintf(stderr, "**** Error: node %d does not exist (num nodes = %d)\n", node, nnodes);
        exit(-1);
    }
    nodeid_t target_node = (id & 0xFFC0)+node;

    /* determine whether to read or write based on args_found */
    if ((isQuad1394 && (args_found == 1)) ||
            (!isQuad1394 && (args_found <= 2)))
    {
        if (isBroadcast) {
            fprintf(stderr, "**** Error: broadcast read NOT supported on node %d (num nodes = %d)\n", node, nnodes);
        }

        /* read the data block and print out the values */
        rc = raw1394_read(handle, target_node, addr, size*4, data);
        if (!rc) {
            for (j=0; j<size; j++)
                printf("0x%08X\n", bswap_32(data[j]));
        }
    } else {
        /* for write */
        if (isBroadcast) {
            // broadcast, no ack is expected
            rc = raw1394_start_write(handle, target_node, addr, size*4, data, 11);
        } else {
            // asynchronous write
            rc = raw1394_write(handle, target_node, addr, size*4, data);
        }
    }
    if (rc) {
        fprintf(stderr, "**** Error: errno = %d %s \n", errno, strerror(errno));
    }

    // Free memory if it was dynamically allocated
    if (data != &data1)
        free(data);

    raw1394_destroy_handle(handle);
    return 0;
}